

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_size_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  void *pvVar7;
  curl_off_t filesize;
  char *fdigit;
  curl_off_t local_b0;
  char *local_a8 [16];
  
  local_b0 = -1;
  pcVar6 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  if (ftpcode == 0xd5) {
    pcVar6 = pcVar6 + 4;
    pvVar7 = memchr(pcVar6,0xd,(data->conn->proto).ftpc.pp.nfinal);
    local_a8[0] = pcVar6;
    if (pvVar7 != (void *)0x0) {
      local_a8[0] = (char *)((long)pvVar7 + -1);
      if (*(char *)((long)pvVar7 + -1) == '\n') {
        local_a8[0] = (char *)((long)pvVar7 + -2);
      }
      if (pcVar6 < local_a8[0]) {
        cVar1 = local_a8[0][-1];
        pcVar3 = local_a8[0];
        while ((local_a8[0] = pcVar3, (byte)(cVar1 - 0x30U) < 10 &&
               (local_a8[0] = pcVar3 + -1, pcVar6 < local_a8[0]))) {
          cVar1 = pcVar3[-2];
          pcVar3 = local_a8[0];
        }
      }
    }
    iVar4 = Curl_str_number(local_a8,&local_b0,0x7fffffffffffffff);
    if (iVar4 != 0) {
      local_b0 = -1;
    }
  }
  else if (instate != '\x19' && ftpcode == 0x226) {
    Curl_failf(data,"The file does not exist");
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  if (instate == '\x19') {
    (data->state).resume_from = local_b0;
    CVar5 = ftp_state_ul_setup(data,true);
  }
  else if (instate == '\x18') {
    Curl_pgrsSetDownloadSize(data,local_b0);
    CVar5 = ftp_state_retr(data,local_b0);
  }
  else {
    CVar5 = CURLE_OK;
    if (instate == '\x17') {
      if (local_b0 != -1) {
        iVar4 = curl_msnprintf((char *)local_a8,0x80,"Content-Length: %ld\r\n");
        uVar2 = *(ulong *)&(data->set).field_0x894;
        *(ulong *)&(data->set).field_0x894 = uVar2 | 0x4000000;
        CVar5 = Curl_client_write(data,4,(char *)local_a8,(long)iVar4);
        *(ulong *)&(data->set).field_0x894 =
             *(ulong *)&(data->set).field_0x894 & 0xfffffffffbffffff | uVar2 & 0x4000000;
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
      Curl_pgrsSetDownloadSize(data,local_b0);
      CVar5 = ftp_state_rest(data,data->conn);
    }
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_size_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  curl_off_t filesize = -1;
  char *buf = Curl_dyn_ptr(&data->conn->proto.ftpc.pp.recvbuf);
  size_t len = data->conn->proto.ftpc.pp.nfinal;

  /* get the size from the ascii string: */
  if(ftpcode == 213) {
    /* To allow servers to prepend "rubbish" in the response string, we scan
       for all the digits at the end of the response and parse only those as a
       number. */
    char *start = &buf[4];
    const char *fdigit = memchr(start, '\r', len);
    if(fdigit) {
      fdigit--;
      if(*fdigit == '\n')
        fdigit--;
      while(ISDIGIT(fdigit[-1]) && (fdigit > start))
        fdigit--;
    }
    else
      fdigit = start;
    if(Curl_str_number(&fdigit, &filesize, CURL_OFF_T_MAX))
      filesize = -1; /* size remain unknown */
  }
  else if(ftpcode == 550) { /* "No such file or directory" */
    /* allow a SIZE failure for (resumed) uploads, when probing what command
       to use */
    if(instate != FTP_STOR_SIZE) {
      failf(data, "The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      int clbuflen = msnprintf(clbuf, sizeof(clbuf),
                "Content-Length: %" FMT_OFF_T "\r\n", filesize);
      result = client_write_header(data, clbuf, clbuflen);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(data, data->conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(data, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(data, TRUE);
  }

  return result;
}